

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::MatchLiteralNode::TransferPass1
          (MatchLiteralNode *this,Compiler *compiler,Char *litbuf)

{
  uint uVar1;
  CharCount CVar2;
  Program *pPVar3;
  char16_t *pcVar4;
  code *pcVar5;
  bool bVar6;
  uint uVar7;
  undefined4 *puVar8;
  Type *pTVar9;
  ulong uVar10;
  uint uVar11;
  
  pPVar3 = compiler->program;
  uVar1 = (pPVar3->rep).insts.litbufLen;
  if (this->isEquivClass == false) {
    pTVar9 = &(pPVar3->rep).insts.litbufLen;
    uVar7 = this->length;
    if ((ulong)uVar7 != 0) {
      CVar2 = this->offset;
      pcVar4 = (pPVar3->rep).insts.litbuf.ptr;
      uVar10 = 0;
      do {
        pcVar4[uVar1 + (int)uVar10] = litbuf[CVar2 + (int)uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
  }
  else {
    if ((pPVar3->flags & IgnoreCaseRegexFlag) == NoRegexFlags) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x345,"((compiler.program->flags & IgnoreCaseRegexFlag) != 0)",
                         "(compiler.program->flags & IgnoreCaseRegexFlag) != 0");
      if (!bVar6) {
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar8 = 0;
    }
    uVar7 = this->length;
    if (uVar7 != 0) {
      uVar11 = 0;
      uVar10 = 0;
      do {
        StandardChars<char16_t>::ToEquivs
                  (compiler->standardChars,compiler->program->flags >> 3 & CaseFolding,
                   litbuf[this->offset + (int)uVar10],
                   (compiler->program->rep).insts.litbuf.ptr + (ulong)uVar1 + (ulong)uVar11);
        uVar10 = uVar10 + 1;
        uVar7 = this->length;
        uVar11 = uVar11 + 4;
      } while (uVar10 < uVar7);
    }
    uVar7 = uVar7 << 2;
    pTVar9 = &(compiler->program->rep).insts.litbufLen;
  }
  *pTVar9 = *pTVar9 + uVar7;
  this->offset = uVar1;
  return;
}

Assistant:

void MatchLiteralNode::TransferPass1(Compiler& compiler, const Char* litbuf)
    {
        CharCount nextLit = compiler.program->rep.insts.litbufLen;
        if (isEquivClass)
        {
            Assert((compiler.program->flags & IgnoreCaseRegexFlag) != 0);
            // Expand literal according to character equivalence classes
            for (CharCount i = 0; i < length; i++)
            {
                compiler.standardChars->ToEquivs(
                    compiler.program->GetCaseMappingSource(),
                    litbuf[offset + i],
                    compiler.program->rep.insts.litbuf + nextLit + i * CaseInsensitive::EquivClassSize);
            }
            compiler.program->rep.insts.litbufLen += length * CaseInsensitive::EquivClassSize;
        }
        else
        {
            for (CharCount i = 0; i < length; i++)
                compiler.program->rep.insts.litbuf[nextLit + i] = litbuf[offset + i];
            compiler.program->rep.insts.litbufLen += length;
        }
        offset = nextLit;
    }